

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_HPKE_Curve51_CP256_SHA512.c
# Opt level: O1

uint32_t Hacl_HPKE_Curve51_CP256_SHA512_setupBaseS
                   (uint8_t *o_pkE,Hacl_Impl_HPKE_context_s o_ctx,uint8_t *skE,uint8_t *pkR,
                   uint32_t infolen,uint8_t *info)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [24];
  undefined1 auVar4 [24];
  undefined1 auVar5 [32];
  undefined1 *puVar6;
  byte bVar7;
  uint ikmlen;
  ulong uVar8;
  uint32_t i;
  long lVar9;
  byte bVar10;
  uint8_t *puVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  uint8_t local_268 [9];
  undefined4 uStack_25f;
  undefined1 uStack_25b;
  undefined5 uStack_25a;
  undefined3 uStack_255;
  undefined5 uStack_252;
  undefined5 uStack_24d;
  undefined3 uStack_248;
  uint8_t auStack_245 [8];
  uint8_t auStack_23d [8];
  undefined8 uStack_235;
  undefined5 local_22d;
  undefined3 uStack_228;
  uint8_t auStack_225 [8];
  uint8_t auStack_21d [8];
  undefined5 uStack_215;
  undefined3 uStack_210;
  undefined5 uStack_20d;
  uint8_t local_208 [27];
  undefined5 uStack_1ed;
  undefined3 local_1e8;
  uint8_t auStack_1e5 [8];
  uint8_t auStack_1dd [13];
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  uint8_t suite_id_kem [5];
  undefined1 auStack_188 [8];
  uint8_t zeros [32];
  undefined1 auStack_148 [8];
  uint8_t o_eae_prk [32];
  undefined8 uStack_110;
  uint8_t auStack_108 [8];
  uint8_t o_shared [32];
  uint8_t o_dh [32];
  undefined8 uStack_a8;
  uint8_t o_kemcontext [64];
  undefined8 local_50;
  uint8_t suite_id [10];
  uint local_34;
  
  auStack_108[0] = '\0';
  auStack_108[1] = '\0';
  auStack_108[2] = '\0';
  auStack_108[3] = '\0';
  auStack_108[4] = '\0';
  auStack_108[5] = '\0';
  auStack_108[6] = '\0';
  auStack_108[7] = '\0';
  o_shared[0] = '\0';
  o_shared[1] = '\0';
  o_shared[2] = '\0';
  o_shared[3] = '\0';
  o_shared[4] = '\0';
  o_shared[5] = '\0';
  o_shared[6] = '\0';
  o_shared[7] = '\0';
  o_shared[8] = '\0';
  o_shared[9] = '\0';
  o_shared[10] = '\0';
  o_shared[0xb] = '\0';
  o_shared[0xc] = '\0';
  o_shared[0xd] = '\0';
  o_shared[0xe] = '\0';
  o_shared[0xf] = '\0';
  o_shared[0x10] = '\0';
  o_shared[0x11] = '\0';
  o_shared[0x12] = '\0';
  o_shared[0x13] = '\0';
  o_shared[0x14] = '\0';
  o_shared[0x15] = '\0';
  o_shared[0x16] = '\0';
  o_shared[0x17] = '\0';
  uStack_1d0 = 0x1d6549;
  Hacl_Curve25519_51_secret_to_public(o_pkE,skE);
  _auStack_188 = ZEXT1632(ZEXT816(0) << 0x40);
  uStack_1d0 = 0x1d656e;
  unique0x10001a24 = _auStack_188;
  Hacl_Curve25519_51_scalarmult(o_shared + 0x18,skE,pkR);
  bVar10 = 0xff;
  lVar9 = 0;
  do {
    uStack_1d0 = 0x1d658b;
    bVar7 = FStar_UInt8_eq_mask(o_shared[lVar9 + 0x18],auStack_188[lVar9]);
    auVar14 = stack0xffffffffffffff18;
    bVar10 = bVar10 & bVar7;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x20);
  if (bVar10 != 0xff) {
    auVar3 = *(undefined1 (*) [24])o_pkE;
    uVar1 = *(undefined8 *)(o_pkE + 0x18);
    auVar4 = *(undefined1 (*) [24])pkR;
    uVar2 = *(undefined8 *)(pkR + 0x18);
    _auStack_148 = ZEXT1632(ZEXT816(0) << 0x40);
    uStack_1c8 = CONCAT35(uStack_1c8._5_3_,0x20004d454b);
    builtin_memcpy(local_208,"HPKE-v1KEM",0xb);
    builtin_memcpy(local_208 + 0xb," eae_prk",8);
    local_208[0x13] = o_shared[0x18];
    local_208[0x14] = o_shared[0x19];
    local_208[0x15] = o_shared[0x1a];
    local_208[0x16] = o_shared[0x1b];
    local_208[0x17] = o_shared[0x1c];
    local_208[0x18] = o_shared[0x1d];
    local_208[0x19] = o_shared[0x1e];
    local_208[0x1a] = o_shared[0x1f];
    uStack_1ed = auVar14._8_5_;
    local_1e8 = auVar14._13_3_;
    auStack_1e5[0] = o_dh[8];
    auStack_1e5[1] = o_dh[9];
    auStack_1e5[2] = o_dh[10];
    auStack_1e5[3] = o_dh[0xb];
    auStack_1e5[4] = o_dh[0xc];
    auStack_1e5[5] = o_dh[0xd];
    auStack_1e5[6] = o_dh[0xe];
    auStack_1e5[7] = o_dh[0xf];
    auStack_1dd[0] = o_dh[0x10];
    auStack_1dd[1] = o_dh[0x11];
    auStack_1dd[2] = o_dh[0x12];
    auStack_1dd[3] = o_dh[0x13];
    auStack_1dd[4] = o_dh[0x14];
    auStack_1dd[5] = o_dh[0x15];
    auStack_1dd[6] = o_dh[0x16];
    auStack_1dd[7] = o_dh[0x17];
    uStack_210 = 0x1d665d;
    uStack_20d = 0;
    unique0x10001a44 = auVar14;
    unique0x10001a64 = &uStack_1c8;
    Hacl_HKDF_extract_sha2_256(auStack_148,(uint8_t *)&uStack_1c8,0,local_208,0x33);
    local_268[0] = '\0';
    local_268[1] = ' ';
    local_268[2] = 'H';
    local_268[3] = 'P';
    local_268[4] = 'K';
    local_268[5] = 'E';
    local_268[6] = '-';
    local_268[7] = 'v';
    local_268[8] = 0x31;
    uStack_25f = (undefined4)uStack_1c8;
    uStack_25b = uStack_1c8._4_1_;
    uStack_25a = 0x6572616873;
    uStack_255 = 0x735f64;
    uStack_252 = 0x7465726365;
    o_kemcontext._0_8_ = auVar3._8_8_;
    o_kemcontext._8_8_ = auVar3._16_8_;
    o_kemcontext._32_8_ = auVar4._8_8_;
    o_kemcontext._40_8_ = auVar4._16_8_;
    uStack_24d = auVar3._0_5_;
    uStack_248 = auVar3._5_3_;
    auStack_245[0] = o_kemcontext[0];
    auStack_245[1] = o_kemcontext[1];
    auStack_245[2] = o_kemcontext[2];
    auStack_245[3] = o_kemcontext[3];
    auStack_245[4] = o_kemcontext[4];
    auStack_245[5] = o_kemcontext[5];
    auStack_245[6] = o_kemcontext[6];
    auStack_245[7] = o_kemcontext[7];
    auStack_23d[0] = o_kemcontext[8];
    auStack_23d[1] = o_kemcontext[9];
    auStack_23d[2] = o_kemcontext[10];
    auStack_23d[3] = o_kemcontext[0xb];
    auStack_23d[4] = o_kemcontext[0xc];
    auStack_23d[5] = o_kemcontext[0xd];
    auStack_23d[6] = o_kemcontext[0xe];
    auStack_23d[7] = o_kemcontext[0xf];
    local_22d = auVar4._0_5_;
    uStack_228 = auVar4._5_3_;
    auStack_225[0] = o_kemcontext[0x20];
    auStack_225[1] = o_kemcontext[0x21];
    auStack_225[2] = o_kemcontext[0x22];
    auStack_225[3] = o_kemcontext[0x23];
    auStack_225[4] = o_kemcontext[0x24];
    auStack_225[5] = o_kemcontext[0x25];
    auStack_225[6] = o_kemcontext[0x26];
    auStack_225[7] = o_kemcontext[0x27];
    auStack_21d[0] = o_kemcontext[0x28];
    auStack_21d[1] = o_kemcontext[0x29];
    auStack_21d[2] = o_kemcontext[0x2a];
    auStack_21d[3] = o_kemcontext[0x2b];
    auStack_21d[4] = o_kemcontext[0x2c];
    auStack_21d[5] = o_kemcontext[0x2d];
    auStack_21d[6] = o_kemcontext[0x2e];
    auStack_21d[7] = o_kemcontext[0x2f];
    uStack_215 = (undefined5)uVar2;
    uStack_210 = (undefined3)((ulong)uVar2 >> 0x28);
    uStack_235 = uVar1;
    Hacl_HKDF_expand_sha2_256(auStack_108,auStack_148,0x20,local_268,0x5b,0x20);
    puVar6 = (undefined1 *)stack0xffffffffffffffc0;
    _auStack_188 = ZEXT1632(ZEXT816(0) << 0x40);
    local_50 = 0x3002000454b5048;
    suite_id[0] = '\0';
    suite_id[1] = '\x03';
    _auStack_148 = ZEXT1632(ZEXT816(0) << 0x40);
    puVar11 = (uint8_t *)((long)stack0xffffffffffffffc0 + -0x20);
    unique0x100019e4 = _auStack_188;
    unique0x10001a04 = _auStack_148;
    *(undefined1 (*) [16])((long)stack0xffffffffffffffc0 + -0x20) = ZEXT416(0) << 0x40;
    *(undefined1 (*) [16])(puVar6 + -0x14) = ZEXT416(0) << 0x40;
    *(undefined4 *)(puVar6 + -0x20) = 0x454b5048;
    *(undefined2 *)(puVar6 + -0x1c) = 0x762d;
    puVar6[-0x1a] = 0x31;
    *(undefined8 *)(puVar6 + -0x19) = local_50;
    *(undefined2 *)(puVar6 + -0x11) = suite_id._0_2_;
    *(undefined8 *)(puVar6 + -0xf) = 0x685f64695f6b7370;
    *(undefined4 *)(puVar6 + -8) = 0x68736168;
    *(undefined8 *)(puVar6 + -0x28) = 0x1d67b0;
    Hacl_HKDF_extract_sha2_512(auStack_148,(uint8_t *)&local_50,0,puVar11,0x1c);
    uStack_1c8 = 0;
    _suite_id_kem = 0;
    ikmlen = infolen + 0x1a;
    uVar8 = (ulong)ikmlen + 0xf & 0xfffffffffffffff0;
    puVar11 = puVar11 + -uVar8;
    puVar11[-8] = 0xf1;
    puVar11[-7] = 'g';
    puVar11[-6] = '\x1d';
    puVar11[-5] = '\0';
    puVar11[-4] = '\0';
    puVar11[-3] = '\0';
    puVar11[-2] = '\0';
    puVar11[-1] = '\0';
    memset(puVar11,0,(ulong)ikmlen);
    puVar11[0] = 'H';
    puVar11[1] = 'P';
    puVar11[2] = 'K';
    puVar11[3] = 'E';
    puVar11[4] = '-';
    puVar11[5] = 'v';
    puVar11[6] = '1';
    *(undefined8 *)(puVar11 + 7) = local_50;
    *(undefined2 *)(puVar11 + 0xf) = suite_id._0_2_;
    puVar11[0x11] = 'i';
    puVar11[0x12] = 'n';
    puVar11[0x13] = 'f';
    puVar11[0x14] = 'o';
    puVar11[0x15] = '_';
    puVar11[0x16] = 'h';
    puVar11[0x17] = 'a';
    puVar11[0x18] = 's';
    puVar6[-7 - uVar8] = 0x68;
    puVar11[-8] = 'C';
    puVar11[-7] = 'h';
    puVar11[-6] = '\x1d';
    puVar11[-5] = '\0';
    puVar11[-4] = '\0';
    puVar11[-3] = '\0';
    puVar11[-2] = '\0';
    puVar11[-1] = '\0';
    memcpy(puVar11 + 0x1a,info,(ulong)infolen);
    puVar11[-8] = 'a';
    puVar11[-7] = 'h';
    puVar11[-6] = '\x1d';
    puVar11[-5] = '\0';
    puVar11[-4] = '\0';
    puVar11[-3] = '\0';
    puVar11[-2] = '\0';
    puVar11[-1] = '\0';
    Hacl_HKDF_extract_sha2_512((uint8_t *)&uStack_1c8,(uint8_t *)&local_50,0,puVar11,ikmlen);
    auVar5 = stack0xfffffffffffffed8;
    auVar14 = _auStack_148;
    uVar1 = o_eae_prk._16_8_;
    uVar2 = uStack_110;
    stack0xffffffffffffff18 = ZEXT1632(CONCAT88(_suite_id_kem,uStack_1c8));
    *(undefined1 (*) [16])(puVar11 + -0x20) = ZEXT816(0) << 0x20;
    puVar11[-0x11] = '\0';
    puVar11[-0x10] = '\0';
    puVar11[-0xf] = '\0';
    puVar11[-0xe] = '\0';
    puVar11[-0xd] = '\0';
    puVar11[-0xc] = '\0';
    puVar11[-0xb] = '\0';
    puVar11[-10] = '\0';
    puVar11[-0x20] = 'H';
    puVar11[-0x1f] = 'P';
    puVar11[-0x1e] = 'K';
    puVar11[-0x1d] = 'E';
    puVar11[-0x1c] = '-';
    puVar11[-0x1b] = 'v';
    puVar11[-0x1a] = '1';
    *(undefined8 *)(puVar11 + -0x19) = local_50;
    *(undefined2 *)(puVar11 + -0x11) = suite_id._0_2_;
    puVar11[-0xf] = 's';
    puVar11[-0xe] = 'e';
    puVar11[-0xd] = 'c';
    puVar11[-0xc] = 'r';
    puVar11[-0xb] = 'e';
    puVar11[-10] = 't';
    puVar11[-0x28] = '\r';
    puVar11[-0x27] = 'i';
    puVar11[-0x26] = '\x1d';
    puVar11[-0x25] = '\0';
    puVar11[-0x24] = '\0';
    puVar11[-0x23] = '\0';
    puVar11[-0x22] = '\0';
    puVar11[-0x21] = '\0';
    Hacl_HKDF_extract_sha2_512(auStack_188,auStack_108,0x20,puVar11 + -0x20,0x17);
    auVar12 = ZEXT816(0) << 0x40;
    *(undefined1 (*) [32])(puVar11 + -0xc0) = ZEXT1632(auVar12);
    *(undefined1 (*) [32])(puVar11 + -0x49) = ZEXT1632(auVar12);
    auVar13 = ZEXT1632(auVar12);
    *(undefined1 (*) [32])(puVar11 + -0x60) = auVar13;
    *(undefined1 (*) [32])(puVar11 + -0x80) = auVar13;
    *(undefined1 (*) [32])(puVar11 + -0xa0) = auVar13;
    puVar11[-0xc0] = '\0';
    puVar11[-0xbf] = '@';
    puVar11[-0xbe] = 'H';
    puVar11[-0xbd] = 'P';
    puVar11[-0xbc] = 'K';
    puVar11[-0xbb] = 'E';
    puVar11[-0xba] = '-';
    puVar11[-0xb9] = 'v';
    puVar11[-0xb8] = '1';
    *(undefined8 *)(puVar11 + -0xb7) = local_50;
    *(undefined2 *)(puVar11 + -0xaf) = suite_id._0_2_;
    puVar11[-0xad] = 'e';
    puVar11[-0xac] = 'x';
    puVar11[-0xab] = 'p';
    puVar11[-0xaa] = '\0';
    uStack_a8 = auVar14._0_8_;
    o_kemcontext._0_8_ = auVar14._8_8_;
    o_kemcontext._8_8_ = auVar14._16_8_;
    o_kemcontext._24_8_ = auVar5._0_8_;
    o_kemcontext._32_8_ = auVar5._8_8_;
    o_kemcontext._40_8_ = auVar5._16_8_;
    *(undefined8 *)(puVar11 + -0x89) = o_kemcontext._24_8_;
    *(undefined8 *)(puVar11 + -0x81) = o_kemcontext._32_8_;
    *(undefined8 *)(puVar11 + -0x79) = o_kemcontext._40_8_;
    *(undefined8 *)(puVar11 + -0x71) = uVar2;
    *(undefined8 *)(puVar11 + -0xa9) = uStack_a8;
    *(undefined8 *)(puVar11 + -0xa1) = o_kemcontext._0_8_;
    *(undefined8 *)(puVar11 + -0x99) = o_kemcontext._8_8_;
    *(undefined8 *)(puVar11 + -0x91) = uVar1;
    *(undefined8 *)(puVar11 + -0x69) = o_shared._24_8_;
    *(undefined8 *)(puVar11 + -0x61) = o_dh._0_8_;
    *(undefined8 *)(puVar11 + -0x59) = o_dh._8_8_;
    *(undefined8 *)(puVar11 + -0x51) = o_dh._16_8_;
    puVar11[-0x49] = '\0';
    puVar11[-0x48] = '\0';
    puVar11[-0x47] = '\0';
    puVar11[-0x46] = '\0';
    puVar11[-0x45] = '\0';
    puVar11[-0x44] = '\0';
    puVar11[-0x43] = '\0';
    puVar11[-0x42] = '\0';
    puVar11[-0x41] = '\0';
    puVar11[-0x40] = '\0';
    puVar11[-0x3f] = '\0';
    puVar11[-0x3e] = '\0';
    puVar11[-0x3d] = '\0';
    puVar11[-0x3c] = '\0';
    puVar11[-0x3b] = '\0';
    puVar11[-0x3a] = '\0';
    puVar11[-0x39] = '\0';
    puVar11[-0x38] = '\0';
    puVar11[-0x37] = '\0';
    puVar11[-0x36] = '\0';
    puVar11[-0x35] = '\0';
    puVar11[-0x34] = '\0';
    puVar11[-0x33] = '\0';
    puVar11[-0x32] = '\0';
    puVar11[-0x31] = '\0';
    puVar11[-0x30] = '\0';
    puVar11[-0x2f] = '\0';
    puVar11[-0x2e] = '\0';
    puVar11[-0x2d] = '\0';
    puVar11[-0x2c] = '\0';
    puVar11[-0x2b] = '\0';
    puVar11[-0x2a] = '\0';
    puVar11[-200] = 0xd3;
    puVar11[-199] = 'i';
    puVar11[-0xc6] = '\x1d';
    puVar11[-0xc5] = '\0';
    puVar11[-0xc4] = '\0';
    puVar11[-0xc3] = '\0';
    puVar11[-0xc2] = '\0';
    puVar11[-0xc1] = '\0';
    Hacl_HKDF_expand_sha2_512(o_ctx.ctx_exporter,auStack_188,0x40,puVar11 + -0xc0,0x97,0x40);
    auVar12 = ZEXT816(0) << 0x40;
    *(undefined1 (*) [32])(puVar11 + -0x160) = ZEXT1632(auVar12);
    *(undefined1 (*) [32])(puVar11 + -0xe9) = ZEXT1632(auVar12);
    auVar14 = ZEXT1632(auVar12);
    *(undefined1 (*) [32])(puVar11 + -0x100) = auVar14;
    *(undefined1 (*) [32])(puVar11 + -0x120) = auVar14;
    *(undefined1 (*) [32])(puVar11 + -0x140) = auVar14;
    puVar11[-0x160] = '\0';
    puVar11[-0x15f] = ' ';
    puVar11[-0x15e] = 'H';
    puVar11[-0x15d] = 'P';
    puVar11[-0x15c] = 'K';
    puVar11[-0x15b] = 'E';
    puVar11[-0x15a] = '-';
    puVar11[-0x159] = 'v';
    puVar11[-0x158] = '1';
    *(undefined8 *)(puVar11 + -0x157) = local_50;
    *(undefined2 *)(puVar11 + -0x14f) = suite_id._0_2_;
    puVar11[-0x14d] = 'k';
    puVar11[-0x14c] = 'e';
    puVar11[-0x14b] = 'y';
    puVar11[-0x14a] = '\0';
    *(undefined8 *)(puVar11 + -0x129) = o_kemcontext._24_8_;
    *(undefined8 *)(puVar11 + -0x121) = o_kemcontext._32_8_;
    *(undefined8 *)(puVar11 + -0x119) = o_kemcontext._40_8_;
    *(undefined8 *)(puVar11 + -0x111) = uVar2;
    *(undefined8 *)(puVar11 + -0x149) = uStack_a8;
    *(undefined8 *)(puVar11 + -0x141) = o_kemcontext._0_8_;
    *(undefined8 *)(puVar11 + -0x139) = o_kemcontext._8_8_;
    *(undefined8 *)(puVar11 + -0x131) = uVar1;
    *(undefined8 *)(puVar11 + -0x109) = o_shared._24_8_;
    *(undefined8 *)(puVar11 + -0x101) = o_dh._0_8_;
    *(undefined8 *)(puVar11 + -0xf9) = o_dh._8_8_;
    *(undefined8 *)(puVar11 + -0xf1) = o_dh._16_8_;
    puVar11[-0xe9] = '\0';
    puVar11[-0xe8] = '\0';
    puVar11[-0xe7] = '\0';
    puVar11[-0xe6] = '\0';
    puVar11[-0xe5] = '\0';
    puVar11[-0xe4] = '\0';
    puVar11[-0xe3] = '\0';
    puVar11[-0xe2] = '\0';
    puVar11[-0xe1] = '\0';
    puVar11[-0xe0] = '\0';
    puVar11[-0xdf] = '\0';
    puVar11[-0xde] = '\0';
    puVar11[-0xdd] = '\0';
    puVar11[-0xdc] = '\0';
    puVar11[-0xdb] = '\0';
    puVar11[-0xda] = '\0';
    puVar11[-0xd9] = '\0';
    puVar11[-0xd8] = '\0';
    puVar11[-0xd7] = '\0';
    puVar11[-0xd6] = '\0';
    puVar11[-0xd5] = '\0';
    puVar11[-0xd4] = '\0';
    puVar11[-0xd3] = '\0';
    puVar11[-0xd2] = '\0';
    puVar11[-0xd1] = '\0';
    puVar11[-0xd0] = '\0';
    puVar11[-0xcf] = '\0';
    puVar11[-0xce] = '\0';
    puVar11[-0xcd] = '\0';
    puVar11[-0xcc] = '\0';
    puVar11[-0xcb] = '\0';
    puVar11[-0xca] = '\0';
    puVar11[-0x168] = 0x9b;
    puVar11[-0x167] = 'j';
    puVar11[-0x166] = '\x1d';
    puVar11[-0x165] = '\0';
    puVar11[-0x164] = '\0';
    puVar11[-0x163] = '\0';
    puVar11[-0x162] = '\0';
    puVar11[-0x161] = '\0';
    Hacl_HKDF_expand_sha2_512(o_ctx.ctx_key,auStack_188,0x40,puVar11 + -0x160,0x97,0x20);
    auVar12 = ZEXT816(0) << 0x40;
    *(undefined1 (*) [32])(puVar11 + -0x200) = ZEXT1632(auVar12);
    *(undefined1 (*) [32])(puVar11 + -0x182) = ZEXT1632(auVar12);
    auVar14 = ZEXT1632(auVar12);
    *(undefined1 (*) [32])(puVar11 + -0x1a0) = auVar14;
    *(undefined1 (*) [32])(puVar11 + -0x1c0) = auVar14;
    *(undefined1 (*) [32])(puVar11 + -0x1e0) = auVar14;
    puVar11[-0x200] = '\0';
    puVar11[-0x1ff] = '\f';
    puVar11[-0x1fe] = 'H';
    puVar11[-0x1fd] = 'P';
    puVar11[-0x1fc] = 'K';
    puVar11[-0x1fb] = 'E';
    puVar11[-0x1fa] = '-';
    puVar11[-0x1f9] = 'v';
    puVar11[-0x1f8] = '1';
    *(undefined8 *)(puVar11 + -0x1f7) = local_50;
    *(undefined2 *)(puVar11 + -0x1ef) = suite_id._0_2_;
    puVar11[-0x1ed] = 'b';
    puVar11[-0x1ec] = 'a';
    puVar11[-0x1eb] = 's';
    puVar11[-0x1ea] = 'e';
    puVar11[-0x1e9] = '_';
    puVar11[-0x1e8] = 'n';
    puVar11[-0x1e7] = 'o';
    puVar11[-0x1e6] = 'n';
    puVar11[-0x1e5] = 'c';
    puVar11[-0x1e4] = 'e';
    puVar11[-0x1e3] = '\0';
    *(undefined8 *)(puVar11 + -0x1c2) = o_kemcontext._24_8_;
    *(undefined8 *)(puVar11 + -0x1ba) = o_kemcontext._32_8_;
    *(undefined8 *)(puVar11 + -0x1b2) = o_kemcontext._40_8_;
    *(undefined8 *)(puVar11 + -0x1aa) = uVar2;
    *(undefined8 *)(puVar11 + -0x1e2) = uStack_a8;
    *(undefined8 *)(puVar11 + -0x1da) = o_kemcontext._0_8_;
    *(undefined8 *)(puVar11 + -0x1d2) = o_kemcontext._8_8_;
    *(undefined8 *)(puVar11 + -0x1ca) = uVar1;
    *(undefined8 *)(puVar11 + -0x1a2) = o_shared._24_8_;
    *(undefined8 *)(puVar11 + -0x19a) = o_dh._0_8_;
    *(undefined8 *)(puVar11 + -0x192) = o_dh._8_8_;
    *(undefined8 *)(puVar11 + -0x18a) = o_dh._16_8_;
    puVar11[-0x182] = '\0';
    puVar11[-0x181] = '\0';
    puVar11[-0x180] = '\0';
    puVar11[-0x17f] = '\0';
    puVar11[-0x17e] = '\0';
    puVar11[-0x17d] = '\0';
    puVar11[-0x17c] = '\0';
    puVar11[-0x17b] = '\0';
    puVar11[-0x17a] = '\0';
    puVar11[-0x179] = '\0';
    puVar11[-0x178] = '\0';
    puVar11[-0x177] = '\0';
    puVar11[-0x176] = '\0';
    puVar11[-0x175] = '\0';
    puVar11[-0x174] = '\0';
    puVar11[-0x173] = '\0';
    puVar11[-0x172] = '\0';
    puVar11[-0x171] = '\0';
    puVar11[-0x170] = '\0';
    puVar11[-0x16f] = '\0';
    puVar11[-0x16e] = '\0';
    puVar11[-0x16d] = '\0';
    puVar11[-0x16c] = '\0';
    puVar11[-0x16b] = '\0';
    puVar11[-0x16a] = '\0';
    puVar11[-0x169] = '\0';
    puVar11[-0x168] = '\0';
    puVar11[-0x167] = '\0';
    puVar11[-0x166] = '\0';
    puVar11[-0x165] = '\0';
    puVar11[-0x164] = '\0';
    puVar11[-0x163] = '\0';
    puVar11[-0x208] = 'u';
    puVar11[-0x207] = 'k';
    puVar11[-0x206] = '\x1d';
    puVar11[-0x205] = '\0';
    puVar11[-0x204] = '\0';
    puVar11[-0x203] = '\0';
    puVar11[-0x202] = '\0';
    puVar11[-0x201] = '\0';
    Hacl_HKDF_expand_sha2_512(o_ctx.ctx_nonce,auStack_188,0x40,puVar11 + -0x200,0x9e,0xc);
    *o_ctx.ctx_seq = 0;
  }
  local_34 = (uint)(bVar10 == 0xff);
  return local_34;
}

Assistant:

uint32_t
Hacl_HPKE_Curve51_CP256_SHA512_setupBaseS(
  uint8_t *o_pkE,
  Hacl_Impl_HPKE_context_s o_ctx,
  uint8_t *skE,
  uint8_t *pkR,
  uint32_t infolen,
  uint8_t *info
)
{
  uint8_t o_shared[32U] = { 0U };
  uint8_t *o_pkE1 = o_pkE;
  Hacl_Curve25519_51_secret_to_public(o_pkE1, skE);
  uint32_t res1 = 0U;
  uint32_t res0;
  if (res1 == 0U)
  {
    uint8_t o_dh[32U] = { 0U };
    uint8_t zeros[32U] = { 0U };
    Hacl_Curve25519_51_scalarmult(o_dh, skE, pkR);
    uint8_t res2 = 255U;
    for (uint32_t i = 0U; i < 32U; i++)
    {
      uint8_t uu____0 = FStar_UInt8_eq_mask(o_dh[i], zeros[i]);
      res2 = (uint32_t)uu____0 & (uint32_t)res2;
    }
    uint8_t z = res2;
    uint32_t res;
    if (z == 255U)
    {
      res = 1U;
    }
    else
    {
      res = 0U;
    }
    uint32_t res20 = res;
    uint8_t o_kemcontext[64U] = { 0U };
    if (res20 == 0U)
    {
      memcpy(o_kemcontext, o_pkE, 32U * sizeof (uint8_t));
      uint8_t *o_pkRm = o_kemcontext + 32U;
      uint8_t *o_pkR = o_pkRm;
      memcpy(o_pkR, pkR, 32U * sizeof (uint8_t));
      uint8_t *o_dhm = o_dh;
      uint8_t o_eae_prk[32U] = { 0U };
      uint8_t suite_id_kem[5U] = { 0U };
      uint8_t *uu____1 = suite_id_kem;
      uu____1[0U] = 0x4bU;
      uu____1[1U] = 0x45U;
      uu____1[2U] = 0x4dU;
      uint8_t *uu____2 = suite_id_kem + 3U;
      uu____2[0U] = 0U;
      uu____2[1U] = 32U;
      uint8_t *empty = suite_id_kem;
      uint8_t label_eae_prk[7U] = { 0x65U, 0x61U, 0x65U, 0x5fU, 0x70U, 0x72U, 0x6bU };
      uint32_t len0 = 51U;
      KRML_CHECK_SIZE(sizeof (uint8_t), len0);
      uint8_t tmp0[len0];
      memset(tmp0, 0U, len0 * sizeof (uint8_t));
      uint8_t *uu____3 = tmp0;
      uu____3[0U] = 0x48U;
      uu____3[1U] = 0x50U;
      uu____3[2U] = 0x4bU;
      uu____3[3U] = 0x45U;
      uu____3[4U] = 0x2dU;
      uu____3[5U] = 0x76U;
      uu____3[6U] = 0x31U;
      memcpy(tmp0 + 7U, suite_id_kem, 5U * sizeof (uint8_t));
      memcpy(tmp0 + 12U, label_eae_prk, 7U * sizeof (uint8_t));
      memcpy(tmp0 + 19U, o_dhm, 32U * sizeof (uint8_t));
      Hacl_HKDF_extract_sha2_256(o_eae_prk, empty, 0U, tmp0, len0);
      uint8_t
      label_shared_secret[13U] =
        {
          0x73U, 0x68U, 0x61U, 0x72U, 0x65U, 0x64U, 0x5fU, 0x73U, 0x65U, 0x63U, 0x72U, 0x65U, 0x74U
        };
      uint32_t len = 91U;
      KRML_CHECK_SIZE(sizeof (uint8_t), len);
      uint8_t tmp[len];
      memset(tmp, 0U, len * sizeof (uint8_t));
      store16_be(tmp, (uint16_t)32U);
      uint8_t *uu____4 = tmp + 2U;
      uu____4[0U] = 0x48U;
      uu____4[1U] = 0x50U;
      uu____4[2U] = 0x4bU;
      uu____4[3U] = 0x45U;
      uu____4[4U] = 0x2dU;
      uu____4[5U] = 0x76U;
      uu____4[6U] = 0x31U;
      memcpy(tmp + 9U, suite_id_kem, 5U * sizeof (uint8_t));
      memcpy(tmp + 14U, label_shared_secret, 13U * sizeof (uint8_t));
      memcpy(tmp + 27U, o_kemcontext, 64U * sizeof (uint8_t));
      Hacl_HKDF_expand_sha2_256(o_shared, o_eae_prk, 32U, tmp, len, 32U);
      res0 = 0U;
    }
    else
    {
      res0 = 1U;
    }
  }
  else
  {
    res0 = 1U;
  }
  if (res0 == 0U)
  {
    uint8_t o_context[129U] = { 0U };
    uint8_t o_secret[64U] = { 0U };
    uint8_t suite_id[10U] = { 0U };
    uint8_t *uu____5 = suite_id;
    uu____5[0U] = 0x48U;
    uu____5[1U] = 0x50U;
    uu____5[2U] = 0x4bU;
    uu____5[3U] = 0x45U;
    uint8_t *uu____6 = suite_id + 4U;
    uu____6[0U] = 0U;
    uu____6[1U] = 32U;
    uint8_t *uu____7 = suite_id + 6U;
    uu____7[0U] = 0U;
    uu____7[1U] = 3U;
    uint8_t *uu____8 = suite_id + 8U;
    uu____8[0U] = 0U;
    uu____8[1U] = 3U;
    uint8_t
    label_psk_id_hash[11U] =
      { 0x70U, 0x73U, 0x6bU, 0x5fU, 0x69U, 0x64U, 0x5fU, 0x68U, 0x61U, 0x73U, 0x68U };
    uint8_t o_psk_id_hash[64U] = { 0U };
    uint8_t *empty = suite_id;
    uint32_t len0 = 28U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len0);
    uint8_t tmp0[len0];
    memset(tmp0, 0U, len0 * sizeof (uint8_t));
    uint8_t *uu____9 = tmp0;
    uu____9[0U] = 0x48U;
    uu____9[1U] = 0x50U;
    uu____9[2U] = 0x4bU;
    uu____9[3U] = 0x45U;
    uu____9[4U] = 0x2dU;
    uu____9[5U] = 0x76U;
    uu____9[6U] = 0x31U;
    memcpy(tmp0 + 7U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp0 + 17U, label_psk_id_hash, 11U * sizeof (uint8_t));
    memcpy(tmp0 + 28U, empty, 0U * sizeof (uint8_t));
    Hacl_HKDF_extract_sha2_512(o_psk_id_hash, empty, 0U, tmp0, len0);
    uint8_t
    label_info_hash[9U] = { 0x69U, 0x6eU, 0x66U, 0x6fU, 0x5fU, 0x68U, 0x61U, 0x73U, 0x68U };
    uint8_t o_info_hash[64U] = { 0U };
    uint32_t len1 = 26U + infolen;
    KRML_CHECK_SIZE(sizeof (uint8_t), len1);
    uint8_t tmp1[len1];
    memset(tmp1, 0U, len1 * sizeof (uint8_t));
    uint8_t *uu____10 = tmp1;
    uu____10[0U] = 0x48U;
    uu____10[1U] = 0x50U;
    uu____10[2U] = 0x4bU;
    uu____10[3U] = 0x45U;
    uu____10[4U] = 0x2dU;
    uu____10[5U] = 0x76U;
    uu____10[6U] = 0x31U;
    memcpy(tmp1 + 7U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp1 + 17U, label_info_hash, 9U * sizeof (uint8_t));
    memcpy(tmp1 + 26U, info, infolen * sizeof (uint8_t));
    Hacl_HKDF_extract_sha2_512(o_info_hash, empty, 0U, tmp1, len1);
    o_context[0U] = 0U;
    memcpy(o_context + 1U, o_psk_id_hash, 64U * sizeof (uint8_t));
    memcpy(o_context + 65U, o_info_hash, 64U * sizeof (uint8_t));
    uint8_t label_secret[6U] = { 0x73U, 0x65U, 0x63U, 0x72U, 0x65U, 0x74U };
    uint32_t len2 = 23U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len2);
    uint8_t tmp2[len2];
    memset(tmp2, 0U, len2 * sizeof (uint8_t));
    uint8_t *uu____11 = tmp2;
    uu____11[0U] = 0x48U;
    uu____11[1U] = 0x50U;
    uu____11[2U] = 0x4bU;
    uu____11[3U] = 0x45U;
    uu____11[4U] = 0x2dU;
    uu____11[5U] = 0x76U;
    uu____11[6U] = 0x31U;
    memcpy(tmp2 + 7U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp2 + 17U, label_secret, 6U * sizeof (uint8_t));
    memcpy(tmp2 + 23U, empty, 0U * sizeof (uint8_t));
    Hacl_HKDF_extract_sha2_512(o_secret, o_shared, 32U, tmp2, len2);
    uint8_t label_exp[3U] = { 0x65U, 0x78U, 0x70U };
    uint32_t len3 = 151U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len3);
    uint8_t tmp3[len3];
    memset(tmp3, 0U, len3 * sizeof (uint8_t));
    store16_be(tmp3, (uint16_t)64U);
    uint8_t *uu____12 = tmp3 + 2U;
    uu____12[0U] = 0x48U;
    uu____12[1U] = 0x50U;
    uu____12[2U] = 0x4bU;
    uu____12[3U] = 0x45U;
    uu____12[4U] = 0x2dU;
    uu____12[5U] = 0x76U;
    uu____12[6U] = 0x31U;
    memcpy(tmp3 + 9U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp3 + 19U, label_exp, 3U * sizeof (uint8_t));
    memcpy(tmp3 + 22U, o_context, 129U * sizeof (uint8_t));
    Hacl_HKDF_expand_sha2_512(o_ctx.ctx_exporter, o_secret, 64U, tmp3, len3, 64U);
    uint8_t label_key[3U] = { 0x6bU, 0x65U, 0x79U };
    uint32_t len4 = 151U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len4);
    uint8_t tmp4[len4];
    memset(tmp4, 0U, len4 * sizeof (uint8_t));
    store16_be(tmp4, (uint16_t)32U);
    uint8_t *uu____13 = tmp4 + 2U;
    uu____13[0U] = 0x48U;
    uu____13[1U] = 0x50U;
    uu____13[2U] = 0x4bU;
    uu____13[3U] = 0x45U;
    uu____13[4U] = 0x2dU;
    uu____13[5U] = 0x76U;
    uu____13[6U] = 0x31U;
    memcpy(tmp4 + 9U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp4 + 19U, label_key, 3U * sizeof (uint8_t));
    memcpy(tmp4 + 22U, o_context, 129U * sizeof (uint8_t));
    Hacl_HKDF_expand_sha2_512(o_ctx.ctx_key, o_secret, 64U, tmp4, len4, 32U);
    uint8_t
    label_base_nonce[10U] =
      { 0x62U, 0x61U, 0x73U, 0x65U, 0x5fU, 0x6eU, 0x6fU, 0x6eU, 0x63U, 0x65U };
    uint32_t len = 158U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len);
    uint8_t tmp[len];
    memset(tmp, 0U, len * sizeof (uint8_t));
    store16_be(tmp, (uint16_t)12U);
    uint8_t *uu____14 = tmp + 2U;
    uu____14[0U] = 0x48U;
    uu____14[1U] = 0x50U;
    uu____14[2U] = 0x4bU;
    uu____14[3U] = 0x45U;
    uu____14[4U] = 0x2dU;
    uu____14[5U] = 0x76U;
    uu____14[6U] = 0x31U;
    memcpy(tmp + 9U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp + 19U, label_base_nonce, 10U * sizeof (uint8_t));
    memcpy(tmp + 29U, o_context, 129U * sizeof (uint8_t));
    Hacl_HKDF_expand_sha2_512(o_ctx.ctx_nonce, o_secret, 64U, tmp, len, 12U);
    o_ctx.ctx_seq[0U] = 0ULL;
    return res0;
  }
  return res0;
}